

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O0

void __thiscall
cmFileSet::EvaluateFileEntry
          (cmFileSet *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *filesPerDir,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *cge,cmLocalGenerator *lg,string *config,cmGeneratorTarget *target,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  string_view arg;
  undefined8 config_00;
  bool bVar1;
  pointer this_00;
  string *psVar2;
  reference pbVar3;
  ostream *poVar4;
  cmake *this_01;
  mapped_type *this_02;
  undefined1 local_400 [16];
  string local_3f0;
  reference local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dir_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  ostringstream e;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  string collapsedDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dir;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string relDir;
  undefined1 local_190 [7];
  bool found;
  string collapsedFile;
  cmAlphaNum local_140;
  string local_110;
  undefined1 local_f0 [8];
  string file;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_78;
  string local_58 [8];
  string files;
  string *config_local;
  cmLocalGenerator *lg_local;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *cge_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *filesPerDir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs_local;
  cmFileSet *this_local;
  
  files.field_2._8_8_ = config;
  this_00 = std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::operator->(cge);
  config_00 = files.field_2._8_8_;
  std::__cxx11::string::string((string *)&local_78);
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,lg,(string *)config_00,target,dagChecker,(cmGeneratorTarget *)0x0,
                      &local_78);
  std::__cxx11::string::string(local_58,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_78);
  arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
  cmExpandedList_abi_cxx11_(&local_a8,arg,false);
  local_90 = &local_a8;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_90);
  local_c8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_90);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_c8), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_f0,(string *)pbVar3);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_f0);
    if (!bVar1) {
      psVar2 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(lg);
      cmAlphaNum::cmAlphaNum(&local_140,psVar2);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&collapsedFile.field_2 + 8),'/');
      cmStrCat<std::__cxx11::string>
                (&local_110,&local_140,(cmAlphaNum *)((long)&collapsedFile.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    cmsys::SystemTools::CollapseFullPath((string *)local_190,(string *)local_f0);
    relDir.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(dirs);
    dir = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(dirs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&dir), bVar1) {
      collapsedDir.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      cmsys::SystemTools::CollapseFullPath((string *)local_1f8,(string *)collapsedDir.field_2._8_8_)
      ;
      bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_190,(string *)local_1f8);
      if (bVar1) {
        relDir.field_2._M_local_buf[0xf] = '\x01';
        cmSystemTools::RelativePath(&local_238,(string *)local_1f8,(string *)local_190);
        cmsys::SystemTools::GetParentDirectory(&local_218,&local_238);
        std::__cxx11::string::operator=((string *)&__range2,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        file.field_2._12_4_ = 4;
      }
      else {
        file.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_1f8);
      if (file.field_2._12_4_ != 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if ((relDir.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range3);
      poVar4 = std::operator<<((ostream *)&__range3,"File:\n  ");
      poVar4 = std::operator<<(poVar4,(string *)local_f0);
      std::operator<<(poVar4,"\nmust be in one of the file set\'s base directories:");
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(dirs);
      dir_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(dirs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&dir_1), bVar1) {
        local_3d0 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        poVar4 = std::operator<<((ostream *)&__range3,"\n  ");
        std::operator<<(poVar4,(string *)local_3d0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      this_01 = cmLocalGenerator::GetCMakeInstance(lg);
      std::__cxx11::ostringstream::str();
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::operator->(cge);
      cmCompiledGeneratorExpression::GetBacktrace((cmCompiledGeneratorExpression *)local_400);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_400 + 0x10),
                          (cmListFileBacktrace *)local_400);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_400);
      std::__cxx11::string::~string((string *)(local_400 + 0x10));
      file.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range3);
    }
    else {
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](filesPerDir,(key_type *)&__range2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_02,(value_type *)local_f0);
      file.field_2._12_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)local_190);
    if (file.field_2._12_4_ == 0) {
      file.field_2._12_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_f0);
    if (file.field_2._12_4_ != 0) goto LAB_0068a6ca;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  file.field_2._12_4_ = 2;
LAB_0068a6ca:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if (file.field_2._12_4_ == 2) {
    file.field_2._12_4_ = 0;
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void cmFileSet::EvaluateFileEntry(
  const std::vector<std::string>& dirs,
  std::map<std::string, std::vector<std::string>>& filesPerDir,
  const std::unique_ptr<cmCompiledGeneratorExpression>& cge,
  cmLocalGenerator* lg, const std::string& config,
  const cmGeneratorTarget* target,
  cmGeneratorExpressionDAGChecker* dagChecker) const
{
  auto files = cge->Evaluate(lg, config, target, dagChecker);
  for (std::string file : cmExpandedList(files)) {
    if (!cmSystemTools::FileIsFullPath(file)) {
      file = cmStrCat(lg->GetCurrentSourceDirectory(), '/', file);
    }
    auto collapsedFile = cmSystemTools::CollapseFullPath(file);
    bool found = false;
    std::string relDir;
    for (auto const& dir : dirs) {
      auto collapsedDir = cmSystemTools::CollapseFullPath(dir);
      if (cmSystemTools::IsSubDirectory(collapsedFile, collapsedDir)) {
        found = true;
        relDir = cmSystemTools::GetParentDirectory(
          cmSystemTools::RelativePath(collapsedDir, collapsedFile));
        break;
      }
    }
    if (!found) {
      std::ostringstream e;
      e << "File:\n  " << file
        << "\nmust be in one of the file set's base directories:";
      for (auto const& dir : dirs) {
        e << "\n  " << dir;
      }
      lg->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           cge->GetBacktrace());
      return;
    }

    filesPerDir[relDir].push_back(file);
  }
}